

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::ElemStack::addGlobalPrefix(ElemStack *this,XMLCh *prefixToAdd,uint uriId)

{
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar1;
  PrefMapElem *pPVar2;
  bool bVar3;
  uint uVar4;
  StackElem *pSVar5;
  ulong uVar6;
  XMLSize_t XVar7;
  XMLCh *pXVar8;
  XMLCh XVar9;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar10;
  
  if (this->fGlobalNamespaces == (StackElem *)0x0) {
    pSVar5 = (StackElem *)XMemory::operator_new(0x70,this->fMemoryManager);
    this->fGlobalNamespaces = pSVar5;
    pSVar5->fChildCapacity = 0;
    pSVar5->fChildCount = 0;
    pSVar5->fThisElement = (XMLElementDecl *)0x0;
    pSVar5->fMapCapacity = 0;
    pSVar5->fMapCount = 0;
    pSVar5->fChildren = (QName **)0x0;
    pSVar5->fMap = (PrefMapElem *)0x0;
    pSVar5->fSchemaElemName = (XMLCh *)0x0;
    pSVar5->fSchemaElemNameMaxLen = 0;
    pSVar5->fReaderNum = 0xffffffff;
    pSVar5->fValidationFlag = false;
    pSVar5->fCommentOrPISeen = false;
    pSVar5->fReferenceEscaped = false;
    pSVar5->fCurrentURI = this->fUnknownNamespaceId;
    pSVar5->fCurrentScope = 0xfffffffe;
    pSVar5->fCurrentGrammar = (Grammar *)0x0;
  }
  pRVar1 = (this->fPrefixPool).fHashTable;
  if ((prefixToAdd == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*prefixToAdd, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    XVar9 = prefixToAdd[1];
    if (XVar9 != L'\0') {
      pXVar8 = prefixToAdd + 2;
      do {
        uVar6 = (ulong)(ushort)XVar9 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar9 = *pXVar8;
        pXVar8 = pXVar8 + 1;
      } while (XVar9 != L'\0');
    }
    uVar6 = uVar6 % pRVar1->fHashModulus;
  }
  pRVar10 = pRVar1->fBucketList[uVar6];
  if (pRVar10 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar3 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,prefixToAdd,pRVar10->fKey);
      if (bVar3) {
        if (pRVar10->fData != (PoolElem *)0x0) {
          uVar4 = pRVar10->fData->fId;
          goto LAB_0029bd1d;
        }
        break;
      }
      pRVar10 = pRVar10->fNext;
    } while (pRVar10 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  uVar4 = XMLStringPool::addNewEntry(&this->fPrefixPool,prefixToAdd);
LAB_0029bd1d:
  pSVar5 = this->fGlobalNamespaces;
  XVar7 = pSVar5->fMapCount;
  if (XVar7 == pSVar5->fMapCapacity) {
    expandMap(this,pSVar5);
    pSVar5 = this->fGlobalNamespaces;
    XVar7 = pSVar5->fMapCount;
  }
  pPVar2 = pSVar5->fMap;
  pPVar2[XVar7].fPrefId = uVar4;
  pPVar2[XVar7].fURIId = uriId;
  pSVar5->fMapCount = XVar7 + 1;
  return;
}

Assistant:

void ElemStack::addGlobalPrefix(const XMLCh* const    prefixToAdd
                              , const unsigned int    uriId)
{
    if (!fGlobalNamespaces)
    {
        fGlobalNamespaces = new (fMemoryManager) StackElem;
        fGlobalNamespaces->fChildCapacity = 0;
        fGlobalNamespaces->fChildren = 0;
        fGlobalNamespaces->fMapCapacity = 0;
        fGlobalNamespaces->fMap = 0;
        fGlobalNamespaces->fMapCount = 0;
        fGlobalNamespaces->fSchemaElemName = 0;
        fGlobalNamespaces->fSchemaElemNameMaxLen = 0;
        fGlobalNamespaces->fThisElement = 0;
        fGlobalNamespaces->fReaderNum = 0xFFFFFFFF;
        fGlobalNamespaces->fChildCount = 0;
        fGlobalNamespaces->fValidationFlag = false;
        fGlobalNamespaces->fCommentOrPISeen = false;
        fGlobalNamespaces->fReferenceEscaped = false;
        fGlobalNamespaces->fCurrentURI = fUnknownNamespaceId;
        fGlobalNamespaces->fCurrentScope = Grammar::TOP_LEVEL_SCOPE;
        fGlobalNamespaces->fCurrentGrammar = 0;
    }

    // Map the prefix to its unique id
    const unsigned int prefId = fPrefixPool.addOrFind(prefixToAdd);

    //
    //  Add a new element to the prefix map for this element. If its full,
    //  then expand it out.
    //
    if (fGlobalNamespaces->fMapCount == fGlobalNamespaces->fMapCapacity)
        expandMap(fGlobalNamespaces);

    //
    //  And now add a new element for this prefix. Watch for the special case
    //  of xmlns=="", and force it to ""=[globalid]
    //
    fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fPrefId = prefId;
    if ((prefId == fGlobalPoolId) && (uriId == fEmptyNamespaceId))
        fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fURIId = fEmptyNamespaceId;
    else
        fGlobalNamespaces->fMap[fGlobalNamespaces->fMapCount].fURIId = uriId;

    // Bump the map count now
    fGlobalNamespaces->fMapCount++;
}